

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::LICMPass::ProcessIRContext(LICMPass *this)

{
  Module *pMVar1;
  Status SVar2;
  Status SVar3;
  pointer puVar4;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  SVar3 = SuccessWithoutChange;
  for (puVar4 = *(pointer *)
                 &(pMVar1->functions_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                  ._M_impl;
      (SVar3 != Failure &&
      (puVar4 != *(pointer *)
                  ((long)&(pMVar1->functions_).
                          super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                  + 8))); puVar4 = puVar4 + 1) {
    SVar2 = ProcessFunction(this,(Function *)
                                 (puVar4->_M_t).
                                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                           );
    if ((int)SVar2 < (int)SVar3) {
      SVar3 = SVar2;
    }
  }
  return SVar3;
}

Assistant:

Pass::Status LICMPass::ProcessIRContext() {
  Status status = Status::SuccessWithoutChange;
  Module* module = get_module();

  // Process each function in the module
  for (auto func = module->begin();
       func != module->end() && status != Status::Failure; ++func) {
    status = CombineStatus(status, ProcessFunction(&*func));
  }
  return status;
}